

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lundump.c
# Opt level: O0

LClosure * luaU_undump(lua_State *L,ZIO *Z,char *name)

{
  StkId pTVar1;
  byte bVar2;
  LClosure *pLVar3;
  Proto *pPVar4;
  LClosure *x_;
  TValue *io;
  LClosure *cl;
  LoadState S;
  char *name_local;
  ZIO *Z_local;
  lua_State *L_local;
  
  if ((*name == '@') || (*name == '=')) {
    S.Z = (ZIO *)(name + 1);
  }
  else {
    S.Z = (ZIO *)name;
    if (*name == '\x1b') {
      S.Z = (ZIO *)anon_var_dwarf_226a2;
    }
  }
  cl = (LClosure *)L;
  S.L = (lua_State *)Z;
  S._24_8_ = name;
  checkHeader((LoadState *)&cl);
  bVar2 = LoadByte((LoadState *)&cl);
  pLVar3 = luaF_newLclosure(L,(uint)bVar2);
  pTVar1 = L->top;
  if (9 < (pLVar3->tt & 0xf)) {
    __assert_fail("(((x_)->tt) & 0x0F) < (9+1)",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lundump.c"
                  ,0x130,"LClosure *luaU_undump(lua_State *, ZIO *, const char *)");
  }
  (pTVar1->value_).f = (lua_CFunction)pLVar3;
  pTVar1->tt_ = 0x8006;
  if ((pTVar1->tt_ & 0x8000) != 0) {
    if ((pTVar1->tt_ & 0x8000) == 0) {
      __assert_fail("(((io)->tt_) & (1 << 15))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lundump.c"
                    ,0x130,"LClosure *luaU_undump(lua_State *, ZIO *, const char *)");
    }
    if ((pTVar1->tt_ & 0x7f) != (ushort)((pTVar1->value_).gc)->tt) {
LAB_0014169d:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lundump.c"
                    ,0x130,"LClosure *luaU_undump(lua_State *, ZIO *, const char *)");
    }
    if (L != (lua_State *)0x0) {
      if ((pTVar1->tt_ & 0x8000) == 0) {
        __assert_fail("(((io)->tt_) & (1 << 15))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lundump.c"
                      ,0x130,"LClosure *luaU_undump(lua_State *, ZIO *, const char *)");
      }
      if ((((pTVar1->value_).gc)->marked & (L->l_G->currentwhite ^ 0x18)) != 0) goto LAB_0014169d;
    }
  }
  luaD_inctop(L);
  pPVar4 = luaF_newproto(L);
  pLVar3->p = pPVar4;
  LoadFunction((LoadState *)&cl,pLVar3->p,(TString *)0x0);
  if ((uint)pLVar3->nupvalues != pLVar3->p->sizeupvalues) {
    __assert_fail("cl->nupvalues == cl->p->sizeupvalues",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lundump.c"
                  ,0x134,"LClosure *luaU_undump(lua_State *, ZIO *, const char *)");
  }
  return pLVar3;
}

Assistant:

LClosure *luaU_undump(lua_State *L, ZIO *Z, const char *name) {
  LoadState S;
  LClosure *cl;
  if (*name == '@' || *name == '=')
    S.name = name + 1;
  else if (*name == LUA_SIGNATURE[0])
    S.name = "binary string";
  else
    S.name = name;
  S.L = L;
  S.Z = Z;
  checkHeader(&S);
  cl = luaF_newLclosure(L, LoadByte(&S));
  setclLvalue(L, L->top, cl);
  luaD_inctop(L);
  cl->p = luaF_newproto(L);
  LoadFunction(&S, cl->p, NULL);
  lua_assert(cl->nupvalues == cl->p->sizeupvalues);
  luai_verifycode(L, buff, cl->p);
  return cl;
}